

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_1000_1999.cpp
# Opt level: O2

void __thiscall psy::C::ParserTester::case1016(ParserTester *this)

{
  Expectation *pEVar1;
  initializer_list<psy::C::SyntaxKind> __l;
  allocator_type local_1b4;
  allocator<char> local_1b3;
  SyntaxKind local_1b2;
  _Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1b0;
  string local_198;
  Expectation local_178;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"1E+2",&local_1b3);
  Expectation::Expectation(&local_178);
  local_1b2 = FloatingConstantExpression;
  __l._M_len = 1;
  __l._M_array = &local_1b2;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)&local_1b0,__l,
             &local_1b4);
  pEVar1 = Expectation::AST(&local_178,
                            (vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
                            &local_1b0);
  Expectation::Expectation(&local_c0,pEVar1);
  parseExpression(this,&local_198,&local_c0);
  Expectation::~Expectation(&local_c0);
  std::_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~_Vector_base
            (&local_1b0);
  Expectation::~Expectation(&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  return;
}

Assistant:

void ParserTester::case1016()
{
    parseExpression("1E+2",
                    Expectation().AST( { SyntaxKind::FloatingConstantExpression }));
}